

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

string * Lexer::dequote(string *__return_storage_ptr__,string *input,string *quotes)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  
  pcVar4 = (input->_M_dataplus)._M_p;
  uVar3 = input->_M_string_length;
  if (1 < uVar3) {
    cVar1 = *pcVar4;
    lVar2 = std::__cxx11::string::find((char)quotes,(ulong)(uint)(int)cVar1);
    pcVar4 = (input->_M_dataplus)._M_p;
    uVar3 = input->_M_string_length;
    if ((lVar2 != -1) && (cVar1 == pcVar4[uVar3 - 1])) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar4,pcVar4 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::dequote (const std::string& input, const std::string& quotes)
{
  if (input.length () > 1)
  {
    int quote = input[0];
    if (quotes.find (quote) != std::string::npos)
    {
      size_t len = input.length ();
      if (quote == input[len - 1])
        return input.substr (1, len - 2);
    }
  }

  return input;
}